

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

void __thiscall
TestChain100Setup::MockMempoolMinFee(TestChain100Setup *this,CFeeRate *target_feerate)

{
  CTxMemPool *pCVar1;
  undefined1 auVar2 [24];
  unsigned_long uVar3;
  CScript *in;
  int64_t iVar4;
  CAmount CVar5;
  CAmount CVar6;
  CFeeRate CVar7;
  long in_FS_OFFSET;
  long local_1f8;
  CMutableTransaction mtx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_198;
  undefined1 local_150;
  undefined1 local_88 [32];
  CTransactionRef tx;
  direct_or_indirect local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock1,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
             ,0x229,false);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,
             &((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
               mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
               .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs,"m_node.mempool->cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
             ,0x229,false);
  uVar3 = CTxMemPool::size((this->super_TestingSetup).super_ChainTestingSetup.
                           super_BasicTestingSetup.m_node.mempool._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  if (uVar3 != 0) {
    __assert_fail("m_node.mempool->size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x22b,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool
           ._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  if (target_feerate->nSatoshisPerK <= (pCVar1->m_opts).incremental_relay_feerate.nSatoshisPerK) {
    __assert_fail("target_feerate > m_node.mempool->m_opts.incremental_relay_feerate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x22e,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  if (target_feerate->nSatoshisPerK <= (pCVar1->m_opts).min_relay_feerate.nSatoshisPerK) {
    __assert_fail("target_feerate > m_node.mempool->m_opts.min_relay_feerate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x230,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
  }
  CMutableTransaction::CMutableTransaction(&mtx);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)&local_48,
             &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
              super_RandomMixin<FastRandomContext>);
  local_198._24_8_ = stack0xffffffffffffffd0;
  local_198._32_4_ = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&mtx.vin,(COutPoint *)&local_198._M_first);
  local_1f8 = 100000000;
  local_88._16_8_ = 0;
  local_88._24_8_ = 0;
  local_88._0_8_ = (char *)0x0;
  local_88._8_8_ = 0;
  in = CScript::operator<<((CScript *)local_88,OP_1);
  WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&tx,in);
  local_198._0_8_ = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_198._8_8_ =
       tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_150 = 4;
  GetScriptForDestination((CScript *)&local_48,(CTxDestination *)&local_198._M_first);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&mtx.vout,&local_1f8,(CScript *)&local_48);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_48);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_198._M_first);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_88);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tx);
  local_48.direct[4] = '\0';
  local_48.direct[5] = '\0';
  local_48.direct[6] = '\0';
  local_48.direct[7] = '\0';
  local_48.indirect_contents.capacity = 0;
  local_48.direct[0xc] = '\0';
  local_48.direct[0xd] = '\0';
  local_48.direct[0xe] = '\0';
  local_48.direct[0xf] = '\0';
  local_48.direct[0x10] = '\0';
  local_48.direct[0x11] = '\0';
  local_48.direct[0x12] = '\0';
  local_48.direct[0x13] = '\0';
  iVar4 = GetVirtualTransactionSize
                    (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CVar5 = CFeeRate::GetFee(target_feerate,(uint32_t)iVar4);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool
           ._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  iVar4 = GetVirtualTransactionSize
                    (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CVar6 = CFeeRate::GetFee(&(pCVar1->m_opts).incremental_relay_feerate,(uint32_t)iVar4);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool
           ._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  auVar2._16_4_ = local_48._16_4_;
  auVar2._12_4_ = local_48._12_4_;
  auVar2._8_4_ = local_48.indirect_contents.capacity;
  auVar2._4_4_ = local_48._4_4_;
  auVar2._0_4_ = local_48._0_4_;
  auVar2._20_4_ = 0;
  CTxMemPoolEntry::CTxMemPoolEntry
            ((CTxMemPoolEntry *)&local_198._M_first,&tx,CVar5 - CVar6,0,1,0,true,1,
             (LockPoints)(auVar2 << 0x20));
  CTxMemPool::addUnchecked(pCVar1,(CTxMemPoolEntry *)&local_198._M_first);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)&local_198._M_first);
  CTxMemPool::TrimToSize
            ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
             mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,0,
             (vector<COutPoint,_std::allocator<COutPoint>_> *)0x0);
  CVar7 = CTxMemPool::GetMinFee
                    ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                     m_node.mempool._M_t.
                     super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                     super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                     super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  if (CVar7.nSatoshisPerK == target_feerate->nSatoshisPerK) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    CMutableTransaction::~CMutableTransaction(&mtx);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("m_node.mempool->GetMinFee() == target_feerate",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                ,0x240,"void TestChain100Setup::MockMempoolMinFee(const CFeeRate &)");
}

Assistant:

void TestChain100Setup::MockMempoolMinFee(const CFeeRate& target_feerate)
{
    LOCK2(cs_main, m_node.mempool->cs);
    // Transactions in the mempool will affect the new minimum feerate.
    assert(m_node.mempool->size() == 0);
    // The target feerate cannot be too low...
    // ...otherwise the transaction's feerate will need to be negative.
    assert(target_feerate > m_node.mempool->m_opts.incremental_relay_feerate);
    // ...otherwise this is not meaningful. The feerate policy uses the maximum of both feerates.
    assert(target_feerate > m_node.mempool->m_opts.min_relay_feerate);

    // Manually create an invalid transaction. Manually set the fee in the CTxMemPoolEntry to
    // achieve the exact target feerate.
    CMutableTransaction mtx = CMutableTransaction();
    mtx.vin.emplace_back(COutPoint{Txid::FromUint256(m_rng.rand256()), 0});
    mtx.vout.emplace_back(1 * COIN, GetScriptForDestination(WitnessV0ScriptHash(CScript() << OP_TRUE)));
    const auto tx{MakeTransactionRef(mtx)};
    LockPoints lp;
    // The new mempool min feerate is equal to the removed package's feerate + incremental feerate.
    const auto tx_fee = target_feerate.GetFee(GetVirtualTransactionSize(*tx)) -
        m_node.mempool->m_opts.incremental_relay_feerate.GetFee(GetVirtualTransactionSize(*tx));
    m_node.mempool->addUnchecked(CTxMemPoolEntry(tx, /*fee=*/tx_fee,
                                                 /*time=*/0, /*entry_height=*/1, /*entry_sequence=*/0,
                                                 /*spends_coinbase=*/true, /*sigops_cost=*/1, lp));
    m_node.mempool->TrimToSize(0);
    assert(m_node.mempool->GetMinFee() == target_feerate);
}